

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindUnnest
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *expr,
          idx_t depth,bool root_expression)

{
  string local_48;
  
  (*this->_vptr_ExpressionBinder[0xe])(&local_48);
  BindUnsupportedExpression
            (__return_storage_ptr__,this,&expr->super_ParsedExpression,depth,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindUnnest(FunctionExpression &expr, idx_t depth, bool root_expression) {
	return BindUnsupportedExpression(expr, depth, UnsupportedUnnestMessage());
}